

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++:222:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_xthread_test_c__:222:17)>
             *this)

{
  SourceLocation location;
  SourceLocation location_00;
  Executor *pEVar1;
  long in_FS_OFFSET;
  char local_271;
  DebugComparison<unsigned_int,_int> _kjCondition;
  Mutex *in_stack_fffffffffffffdb0;
  Maybe<kj::_::Mutex::Waiter_&> in_stack_fffffffffffffdb8;
  Maybe<kj::_::Mutex::Waiter_&> *in_stack_fffffffffffffdc0;
  Fault f;
  PromiseFulfillerPair<unsigned_int> paf2;
  PromiseFulfillerPair<unsigned_int> paf;
  WaitScope waitScope;
  EventLoop loop;
  UnixEventPort port;
  
  *(undefined1 *)(in_FS_OFFSET + -0x41) = 1;
  UnixEventPort::UnixEventPort(&port);
  EventLoop::EventLoop(&loop,&port.super_EventPort);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  location.function = (char *)in_stack_fffffffffffffdb8.ptr;
  location.fileName = (char *)in_stack_fffffffffffffdb0;
  location._16_8_ = in_stack_fffffffffffffdc0;
  newPromiseAndFulfiller<unsigned_int>(location);
  Own<kj::PromiseFulfiller<unsigned_int>,_std::nullptr_t>::operator=
            ((this->f).fulfiller,&paf.fulfiller);
  location_00.function = (char *)in_stack_fffffffffffffdb8.ptr;
  location_00.fileName = (char *)in_stack_fffffffffffffdb0;
  location_00._16_8_ = in_stack_fffffffffffffdc0;
  newPromiseAndFulfiller<unsigned_int>(location_00);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(this->f).promise,
             (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&paf2);
  pEVar1 = getCurrentThreadExecutor();
  MutexGuarded<kj::Maybe<const_kj::Executor_&>_>::lockExclusive
            ((MutexGuarded<kj::Maybe<const_kj::Executor_&>_> *)&_kjCondition,(this->f).executor);
  *(Executor **)_kjCondition.op.content.ptr = pEVar1;
  Locked<kj::Maybe<const_kj::Executor_&>_>::~Locked
            ((Locked<kj::Maybe<const_kj::Executor_&>_> *)&_kjCondition);
  _kjCondition.left = Promise<unsigned_int>::wait(&paf.promise,&waitScope);
  _kjCondition.right = 0x7b;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 0x7b;
  if (_kjCondition.result) {
    _kjCondition.left = 0x141;
    _kjCondition.right = 0x7b;
    (*((paf2.fulfiller.ptr)->super_PromiseRejector)._vptr_PromiseRejector[2])();
    EventLoop::run(&loop,0xffffffff);
    MutexGuarded<kj::Maybe<const_kj::Executor_&>_>::lockExclusive
              ((MutexGuarded<kj::Maybe<const_kj::Executor_&>_> *)&stack0xfffffffffffffdb0,
               (this->f).executor);
    _kjCondition._0_8_ = &PTR_check_00581938;
    _kjCondition.op.content.ptr = &local_271;
    f.exception._0_1_ = 0;
    kj::_::Mutex::wait(in_stack_fffffffffffffdb0,&_kjCondition);
    Locked<kj::Maybe<const_kj::Executor_&>_>::~Locked
              ((Locked<kj::Maybe<const_kj::Executor_&>_> *)&stack0xfffffffffffffdb0);
    PromiseFulfillerPair<unsigned_int>::~PromiseFulfillerPair(&paf2);
    PromiseFulfillerPair<unsigned_int>::~PromiseFulfillerPair(&paf);
    WaitScope::~WaitScope(&waitScope);
    EventLoop::~EventLoop(&loop);
    UnixEventPort::~UnixEventPort(&port);
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,int>&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
             ,0xeb,FAILED,"paf.promise.wait(waitScope) == 123","_kjCondition,",&_kjCondition);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }